

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void bluntify(void)

{
  Node *pNVar1;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  _Node_iterator_base<std::pair<const_long,_Node>,_false> right_neighbour_id_00;
  long lVar5;
  iterator iVar6;
  long lVar7;
  Node *this;
  int iVar8;
  int iVar9;
  Node *this_00;
  EdgesIterator EVar10;
  Edges *this_01;
  long expanded_node_id;
  char *in_stack_ffffffffffffff08;
  undefined4 uVar11;
  long local_f0;
  long right_neighbour_id;
  int local_e0;
  __node_type *local_d8;
  Edges *local_d0;
  Edges left_edges;
  pair<long,_long> local_b0;
  EdgesIterator local_a0;
  long local_90;
  EdgesIterator local_88;
  set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  good_edges;
  Edges right_edges;
  
  Logger::debug(logger,"bluntifying graph");
  for (good_edges._M_t._M_impl._0_8_ = 1; (long)good_edges._M_t._M_impl._0_8_ <= Node::last_id;
      good_edges._M_t._M_impl._0_8_ = good_edges._M_t._M_impl._0_8_ + 1) {
    iVar3 = std::
            _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&Node::nodes._M_h,(key_type *)&good_edges);
    if (iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>._M_cur !=
        (__node_type *)0x0) {
      iVar3 = std::
              _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&Node::nodes._M_h,(key_type *)&good_edges);
      bVar2 = Edges::empty((Edges *)((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                           ._M_cur + 0x20));
      iVar8 = 0;
      if (!bVar2) {
        iVar8 = (k + -1) / 2;
      }
      bVar2 = Edges::empty((Edges *)((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                           ._M_cur + 0x38));
      iVar9 = *(int *)((long)iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>.
                             _M_cur + 0x18);
      if (!bVar2) {
        iVar9 = iVar9 + k / -2;
      }
      pcVar4 = Node::get_sequence((Node *)((long)iVar3.
                                                 super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                 ._M_cur + 0x10));
      Node::set_sequence((Node *)((long)iVar3.
                                        super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                        ._M_cur + 0x10),pcVar4 + iVar8,iVar9 - iVar8);
    }
  }
  if ((k & 1U) == 0) {
    local_90 = Node::last_id;
    good_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &good_edges._M_t._M_impl.super__Rb_tree_header._M_header;
    good_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    good_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    good_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    good_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         good_edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (local_f0 = 1; local_f0 <= local_90; local_f0 = local_f0 + 1) {
      iVar3 = std::
              _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&Node::nodes._M_h,&local_f0);
      if (iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>._M_cur !=
          (__node_type *)0x0) {
        right_neighbour_id_00._M_cur =
             (__node_type *)
             std::
             _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&Node::nodes._M_h,&local_f0);
        local_d0 = (Edges *)((long)right_neighbour_id_00._M_cur + 0x38);
        std::vector<long,_std::allocator<long>_>::vector
                  (&right_edges.neighbour_ids,(vector<long,_std::allocator<long>_> *)local_d0);
        EVar10 = Edges::begin(&right_edges);
        left_edges.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)EVar10.edges;
        left_edges.neighbour_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = EVar10.index;
        EVar10 = Edges::end(&right_edges);
        local_a0.edges = EVar10.edges;
        this = (Node *)(((right_neighbour_id_00._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_Node>,_false>).
                        super__Hash_node_value_base<std::pair<const_long,_Node>_>._M_storage.
                        _M_storage.__data + 8);
        local_a0.index = EVar10.index;
        lVar5 = 0;
        local_d8 = right_neighbour_id_00._M_cur;
        while (bVar2 = Edges::EdgesIterator::operator!=((EdgesIterator *)&left_edges,&local_a0),
              bVar2) {
          right_neighbour_id = Edges::EdgesIterator::operator*((EdgesIterator *)&left_edges);
          if (0 < right_neighbour_id) {
            if (lVar5 == 0) {
              Node::get_sequence(this);
              lVar5 = Node::add_node(in_stack_ffffffffffffff08,0,expanded_node_id,
                                     (long)right_neighbour_id_00._M_cur);
              Node::add_edge(this->id,'+',lVar5,'+');
            }
            Edges::erase(local_d0,right_neighbour_id);
            iVar3 = std::
                    _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&Node::nodes._M_h,&right_neighbour_id);
            Edges::erase((Edges *)((long)iVar3.
                                         super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                         ._M_cur + 0x38),this->id);
            Node::add_edge(lVar5,'+',right_neighbour_id,'-');
          }
          Edges::EdgesIterator::operator++((EdgesIterator *)&left_edges);
        }
        this_01 = (Edges *)((long)&((right_neighbour_id_00._M_cur)->
                                   super__Hash_node_value<std::pair<const_long,_Node>,_false>).
                                   super__Hash_node_value_base<std::pair<const_long,_Node>_>.
                                   _M_storage._M_storage + 0x18);
        std::vector<long,_std::allocator<long>_>::vector
                  (&left_edges.neighbour_ids,(vector<long,_std::allocator<long>_> *)this_01);
        EVar10 = Edges::begin(&left_edges);
        local_a0.edges = EVar10.edges;
        local_a0.index = EVar10.index;
        EVar10 = Edges::end(&left_edges);
        right_neighbour_id = (long)EVar10.edges;
        local_e0 = EVar10.index;
        while( true ) {
          bVar2 = Edges::EdgesIterator::operator!=(&local_a0,(EdgesIterator *)&right_neighbour_id);
          if (!bVar2) break;
          lVar5 = Edges::EdgesIterator::operator*(&local_a0);
          if (lVar5 < 0) {
            in_stack_ffffffffffffff08 = (char *)this->id;
            expanded_node_id = -lVar5;
            iVar6 = std::
                    _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
                    ::find(&good_edges._M_t,(key_type *)&expanded_node_id);
            if ((_Rb_tree_header *)iVar6._M_node == &good_edges._M_t._M_impl.super__Rb_tree_header)
            {
              expanded_node_id = -lVar5;
              iVar3 = std::
                      _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&Node::nodes._M_h,(key_type *)&expanded_node_id);
              Edges::erase(this_01,lVar5);
              Edges::erase((Edges *)((long)iVar3.
                                           super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                           ._M_cur + 0x20),-this->id);
              lVar5 = 1;
              if (*(int *)((long)iVar3.super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                 ._M_cur + 0x18) < 2) {
                lVar5 = Edges::size((Edges *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                  ._M_cur + 0x38));
              }
              lVar7 = 1;
              if (*(int *)((long)&(local_d8->
                                  super__Hash_node_value<std::pair<const_long,_Node>,_false>).
                                  super__Hash_node_value_base<std::pair<const_long,_Node>_>.
                                  _M_storage._M_storage + 0x10) < 2) {
                lVar7 = Edges::size(local_d0);
              }
              if ((lVar5 != 0) && (lVar7 != 0)) {
                this_00 = (Node *)((long)iVar3.
                                         super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                         ._M_cur + 0x10);
                pNVar1 = this;
                if (lVar7 <= lVar5) {
                  this_00 = this;
                  pNVar1 = (Node *)((long)iVar3.
                                          super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                          ._M_cur + 0x10);
                }
                if (1 < this_00->sequence_len) {
                  Node::get_sequence(this_00);
                  expanded_node_id =
                       Node::add_node(in_stack_ffffffffffffff08,0,expanded_node_id,(long)this_01);
                  this_00->sequence_len = 1;
                  iVar3 = std::
                          _Hashtable<long,_std::pair<const_long,_Node>,_std::allocator<std::pair<const_long,_Node>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::find(&Node::nodes._M_h,(key_type *)&expanded_node_id);
                  Node::move_right_edges_to
                            (this_00,(Node *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_long,_Node>,_false>
                                                  ._M_cur + 0x10),true);
                  Node::add_edge(this_00->id,'+',expanded_node_id,'+');
                }
                uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
                EVar10 = Edges::begin(&this_00->right_edges);
                expanded_node_id = (long)EVar10.edges;
                in_stack_ffffffffffffff08 = (char *)CONCAT44(uVar11,EVar10.index);
                EVar10 = Edges::end(&this_00->right_edges);
                local_88.edges = EVar10.edges;
                local_88.index = EVar10.index;
                while( true ) {
                  bVar2 = Edges::EdgesIterator::operator!=
                                    ((EdgesIterator *)&expanded_node_id,&local_88);
                  if (!bVar2) break;
                  lVar5 = Edges::EdgesIterator::operator*((EdgesIterator *)&expanded_node_id);
                  if (lVar5 < 0) {
                    lVar5 = -lVar5;
                    Node::add_edge(lVar5,'-',pNVar1->id,'+');
                    local_b0.second = pNVar1->id;
                    local_b0.first = lVar5;
                    std::
                    _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                    ::_M_emplace_unique<std::pair<long,long>>
                              ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                *)&good_edges,&local_b0);
                    local_b0.first = pNVar1->id;
                    local_b0.second = lVar5;
                    std::
                    _Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                    ::_M_emplace_unique<std::pair<long,long>>
                              ((_Rb_tree<std::pair<long,long>,std::pair<long,long>,std::_Identity<std::pair<long,long>>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>>
                                *)&good_edges,&local_b0);
                  }
                  else {
                    Node::add_edge(lVar5,'+',pNVar1->id,'+');
                  }
                  Edges::EdgesIterator::operator++((EdgesIterator *)&expanded_node_id);
                }
              }
            }
          }
          Edges::EdgesIterator::operator++(&local_a0);
        }
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&left_edges);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  ((_Vector_base<long,_std::allocator<long>_> *)&right_edges);
      }
    }
    std::
    _Rb_tree<std::pair<long,_long>,_std::pair<long,_long>,_std::_Identity<std::pair<long,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
    ::~_Rb_tree(&good_edges._M_t);
  }
  return;
}

Assistant:

void bluntify() {
    logger->debug("bluntifying graph");
    for (long i = 1; i <= Node::last_id; ++i) {
        if (Node::nodes.find(i) == Node::nodes.end())
            continue;
        Node &node = Node::nodes.find(i)->second;
        int from, to;
        if (!node.left_edges.empty())
            from = (k - 1) / 2;
        else
            from = 0;
        if (!node.right_edges.empty())
            to = node.sequence_len - k / 2;
        else
            to = node.sequence_len;
        node.set_sequence(node.get_sequence() + from, to - from);
    }
    if (k % 2 == 0) {
        set<pair<long, long>> good_edges;
        long node_last_id = Node::last_id;
        for (long i = 1; i <= node_last_id; ++i) {
            if (Node::nodes.find(i) == Node::nodes.end())
                continue;
            Node &node = Node::nodes.find(i)->second;
            long new_right_node_id = 0;
            auto right_edges = node.right_edges;
            for (long right_neighbour_id : right_edges) {
                if (right_neighbour_id > 0) {
                    if (new_right_node_id == 0) {
                        new_right_node_id = Node::add_node(node.get_sequence() + node.sequence_len, 1);
                        Node::add_edge(node.id, '+', new_right_node_id, '+');
                    }
                    node.right_edges.erase(right_neighbour_id);
                    Node::nodes.find(right_neighbour_id)->second.right_edges.erase(node.id);
                    Node::add_edge(new_right_node_id, '+', right_neighbour_id, '-');
                }
            }
            auto left_edges = node.left_edges;
            for (long left_neighbour_id : left_edges)
                if (left_neighbour_id < 0 &&
                    good_edges.find(pair<long, long>(-1 * left_neighbour_id, node.id)) == good_edges.end()) {
                    Node &left_neighbour = Node::nodes.find(-1 * left_neighbour_id)->second;
                    node.left_edges.erase(left_neighbour_id);
                    left_neighbour.left_edges.erase(node.id * -1);
                    long left_neighbour_right_edge_size =
                            left_neighbour.sequence_len > 1 ? 1 : left_neighbour.right_edges.size();
                    long node_right_edge_size = node.sequence_len > 1 ? 1 : node.right_edges.size();
                    if (left_neighbour_right_edge_size == 0 || node_right_edge_size == 0)
                        continue;
                    Node *from_node, *to_node;
                    if (left_neighbour_right_edge_size < node_right_edge_size) {
                        from_node = &left_neighbour;
                        to_node = &node;
                    } else {
                        from_node = &node;
                        to_node = &left_neighbour;
                    }
                    if (from_node->sequence_len > 1) {
                        long expanded_node_id = Node::add_node(from_node->get_sequence() + 1,
                                                               from_node->sequence_len - 1);
                        from_node->sequence_len = 1;
                        from_node->move_right_edges_to(Node::nodes.find(expanded_node_id)->second);
                        Node::add_edge(from_node->id, '+', expanded_node_id, '+');
                    }
                    for (long right_neighbour_id : from_node->right_edges)
                        if (right_neighbour_id < 0) {
                            Node::add_edge(-1 * right_neighbour_id, '-', to_node->id, '+');
                            good_edges.emplace(pair<long, long>(-1 * right_neighbour_id, to_node->id));
                            good_edges.emplace(pair<long, long>(to_node->id, -1 * right_neighbour_id));
                        } else
                            Node::add_edge(right_neighbour_id, '+', to_node->id, '+');
                }
        }
    }
}